

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_auto_unref(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  ssize_t sVar3;
  uv_buf_t *buf;
  anon_union_8_2_26168aa3_for_data unaff_RBX;
  uv_process_t *puVar4;
  uv_process_t *puVar5;
  code *nread;
  uv_timer_t *puVar6;
  undefined1 auStack_520 [16];
  uv_handle_type uStack_510;
  undefined4 uStack_508;
  undefined4 uStack_4f8;
  uv_stream_t uStack_4e0;
  anon_union_8_2_26168aa3_for_data aStack_3d8;
  int iStack_3c4;
  uv_stdio_container_t uStack_3c0;
  undefined1 auStack_3a8 [16];
  undefined1 auStack_398 [264];
  undefined1 auStack_290 [440];
  undefined1 auStack_d8 [192];
  anon_union_8_2_26168aa3_for_data aStack_18;
  
  init_process_options("spawn_helper1",(uv_exit_cb)0x0);
  uVar2 = uv_default_loop();
  iVar1 = uv_spawn(uVar2,&process,&options);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_0016e8f5;
    iVar1 = uv_is_closing(&process);
    if (iVar1 != 0) goto LAB_0016e8fa;
    uv_close(&process,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_0016e8ff;
    iVar1 = uv_is_closing(&process);
    if (iVar1 != 1) goto LAB_0016e904;
    unaff_RBX.stream = (uv_stream_t *)uv_default_loop();
    uv_walk(unaff_RBX.stream,close_walk_cb,0);
    uv_run(unaff_RBX.stream,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_spawn_auto_unref_cold_1();
LAB_0016e8f5:
    run_test_spawn_auto_unref_cold_2();
LAB_0016e8fa:
    run_test_spawn_auto_unref_cold_3();
LAB_0016e8ff:
    run_test_spawn_auto_unref_cold_4();
LAB_0016e904:
    run_test_spawn_auto_unref_cold_5();
  }
  run_test_spawn_auto_unref_cold_6();
  nread = (code *)auStack_290;
  aStack_3d8 = (anon_union_8_2_26168aa3_for_data)0x16e939;
  aStack_18 = unaff_RBX;
  iStack_3c4 = uv_fs_open(0,nread,"/dev/null",2,0,0);
  if (iStack_3c4 < 0) {
    aStack_3d8 = (anon_union_8_2_26168aa3_for_data)0x16ea96;
    run_test_spawn_fs_open_cold_1();
LAB_0016ea96:
    aStack_3d8 = (anon_union_8_2_26168aa3_for_data)0x16ea9b;
    run_test_spawn_fs_open_cold_2();
LAB_0016ea9b:
    aStack_3d8 = (anon_union_8_2_26168aa3_for_data)0x16eaa0;
    run_test_spawn_fs_open_cold_3();
LAB_0016eaa0:
    aStack_3d8 = (anon_union_8_2_26168aa3_for_data)0x16eaa5;
    run_test_spawn_fs_open_cold_4();
LAB_0016eaa5:
    aStack_3d8 = (anon_union_8_2_26168aa3_for_data)0x16eaaa;
    run_test_spawn_fs_open_cold_5();
LAB_0016eaaa:
    aStack_3d8 = (anon_union_8_2_26168aa3_for_data)0x16eaaf;
    run_test_spawn_fs_open_cold_6();
LAB_0016eaaf:
    aStack_3d8 = (anon_union_8_2_26168aa3_for_data)0x16eab4;
    run_test_spawn_fs_open_cold_7();
LAB_0016eab4:
    aStack_3d8 = (anon_union_8_2_26168aa3_for_data)0x16eab9;
    run_test_spawn_fs_open_cold_8();
  }
  else {
    aStack_3d8 = (anon_union_8_2_26168aa3_for_data)0x16e952;
    uv_fs_req_cleanup(auStack_290);
    aStack_3d8 = (anon_union_8_2_26168aa3_for_data)0x16e965;
    init_process_options("spawn_helper8",exit_cb);
    aStack_3d8 = (anon_union_8_2_26168aa3_for_data)0x16e96a;
    uVar2 = uv_default_loop();
    unaff_RBX.stream = (uv_stream_t *)auStack_398;
    aStack_3d8 = (anon_union_8_2_26168aa3_for_data)0x16e97c;
    nread = (code *)unaff_RBX.stream;
    iVar1 = uv_pipe_init(uVar2,unaff_RBX.stream,0);
    if (iVar1 != 0) goto LAB_0016ea96;
    options.stdio = &uStack_3c0;
    uStack_3c0.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
    options.stdio_count = 1;
    aStack_3d8 = (anon_union_8_2_26168aa3_for_data)0x16e9b0;
    uStack_3c0.data.stream = unaff_RBX.stream;
    uVar2 = uv_default_loop();
    puVar4 = &process;
    aStack_3d8 = (anon_union_8_2_26168aa3_for_data)0x16e9c2;
    iVar1 = uv_spawn(uVar2,&process,&options);
    nread = (code *)puVar4;
    if (iVar1 != 0) goto LAB_0016ea9b;
    aStack_3d8 = (anon_union_8_2_26168aa3_for_data)0x16e9d9;
    auStack_3a8 = uv_buf_init(&iStack_3c4,4);
    nread = (code *)auStack_398;
    aStack_3d8 = (anon_union_8_2_26168aa3_for_data)0x16ea06;
    iVar1 = uv_write(auStack_d8,nread,auStack_3a8,1,write_cb);
    if (iVar1 != 0) goto LAB_0016eaa0;
    aStack_3d8 = (anon_union_8_2_26168aa3_for_data)0x16ea13;
    uVar2 = uv_default_loop();
    nread = (code *)0x0;
    aStack_3d8 = (anon_union_8_2_26168aa3_for_data)0x16ea1d;
    iVar1 = uv_run(uVar2);
    if (iVar1 != 0) goto LAB_0016eaa5;
    nread = (code *)auStack_290;
    aStack_3d8 = (anon_union_8_2_26168aa3_for_data)0x16ea3a;
    iVar1 = uv_fs_close(0,nread,iStack_3c4,0);
    if (iVar1 != 0) goto LAB_0016eaaa;
    if (exit_cb_called != 1) goto LAB_0016eaaf;
    if (close_cb_called != 2) goto LAB_0016eab4;
    aStack_3d8 = (anon_union_8_2_26168aa3_for_data)0x16ea55;
    unaff_RBX.stream = (uv_stream_t *)uv_default_loop();
    aStack_3d8 = (anon_union_8_2_26168aa3_for_data)0x16ea69;
    uv_walk(unaff_RBX.stream,close_walk_cb,0);
    nread = (code *)0x0;
    aStack_3d8 = (anon_union_8_2_26168aa3_for_data)0x16ea73;
    uv_run(unaff_RBX.stream);
    aStack_3d8 = (anon_union_8_2_26168aa3_for_data)0x16ea78;
    uVar2 = uv_default_loop();
    aStack_3d8 = (anon_union_8_2_26168aa3_for_data)0x16ea80;
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  aStack_3d8.stream = (uv_stream_t *)run_test_closed_fd_events;
  run_test_spawn_fs_open_cold_9();
  puVar4 = (uv_process_t *)auStack_520;
  aStack_3d8 = unaff_RBX;
  iVar1 = pipe((int *)puVar4);
  if (iVar1 == 0) {
    init_process_options("spawn_helper4",exit_cb);
    options.stdio_count = 3;
    options.stdio = (uv_stdio_container_t *)(auStack_520 + 8);
    auStack_520._8_4_ = 2;
    uStack_510 = auStack_520._0_4_;
    uStack_508 = 0;
    uStack_4f8 = 0;
    puVar4 = (uv_process_t *)uv_default_loop();
    puVar5 = &process;
    iVar1 = uv_spawn(puVar4,&process,&options);
    nread = (code *)puVar5;
    if (iVar1 != 0) goto LAB_0016ed02;
    uv_unref(&process);
    puVar4 = (uv_process_t *)uv_default_loop();
    nread = (code *)&uStack_4e0;
    iVar1 = uv_pipe_init(puVar4,nread,0);
    if (iVar1 != 0) goto LAB_0016ed07;
    nread._4_4_ = 0;
    nread._0_4_ = auStack_520._0_4_;
    puVar4 = (uv_process_t *)&uStack_4e0;
    iVar1 = uv_pipe_open();
    if (iVar1 != 0) goto LAB_0016ed0c;
    auStack_520._0_4_ = ~UV_UNKNOWN_HANDLE;
    nread = on_alloc;
    puVar4 = (uv_process_t *)&uStack_4e0;
    iVar1 = uv_read_start(puVar4,on_alloc,on_read_once);
    if (iVar1 != 0) goto LAB_0016ed11;
    puVar4 = (uv_process_t *)(ulong)(uint)auStack_520._4_4_;
    nread = (code *)0x1802fd;
    sVar3 = write(auStack_520._4_4_,"",1);
    if (sVar3 != 1) goto LAB_0016ed16;
    puVar4 = (uv_process_t *)uv_default_loop();
    nread = (code *)0x1;
    iVar1 = uv_run();
    if (iVar1 != 0) goto LAB_0016ed1b;
    if (output_used != 1) goto LAB_0016ed20;
    uv_close(&uStack_4e0,close_cb);
    puVar4 = (uv_process_t *)(ulong)(uint)auStack_520._4_4_;
    nread = (code *)0x1802fd;
    sVar3 = write(auStack_520._4_4_,"",1);
    if (sVar3 != 1) goto LAB_0016ed25;
    puVar4 = (uv_process_t *)uv_default_loop();
    puVar6 = &timer;
    iVar1 = uv_timer_init();
    nread = (code *)puVar6;
    if (iVar1 != 0) goto LAB_0016ed2a;
    puVar6 = &timer;
    nread = timer_counter_cb;
    iVar1 = uv_timer_start(&timer,timer_counter_cb,10,0);
    puVar4 = (uv_process_t *)puVar6;
    if (iVar1 != 0) goto LAB_0016ed2f;
    puVar4 = (uv_process_t *)uv_default_loop();
    nread = (code *)0x1;
    iVar1 = uv_run();
    if (iVar1 == 1) {
      puVar4 = (uv_process_t *)uv_default_loop();
      nread = (code *)0x1;
      iVar1 = uv_run();
      if (iVar1 != 0) goto LAB_0016ed48;
    }
    if (timer_counter != 1) goto LAB_0016ed34;
    puVar4 = &process;
    nread = (code *)0xf;
    iVar1 = uv_process_kill();
    if (iVar1 != 0) goto LAB_0016ed39;
    puVar4 = (uv_process_t *)(ulong)(uint)auStack_520._4_4_;
    iVar1 = close(auStack_520._4_4_);
    if (iVar1 != 0) goto LAB_0016ed3e;
    uVar2 = uv_default_loop();
    uv_walk(uVar2,close_walk_cb,0);
    nread = (code *)0x0;
    uv_run(uVar2);
    puVar4 = (uv_process_t *)uv_default_loop();
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_closed_fd_events_cold_1();
LAB_0016ed02:
    run_test_closed_fd_events_cold_2();
LAB_0016ed07:
    run_test_closed_fd_events_cold_3();
LAB_0016ed0c:
    run_test_closed_fd_events_cold_4();
LAB_0016ed11:
    run_test_closed_fd_events_cold_5();
LAB_0016ed16:
    run_test_closed_fd_events_cold_6();
LAB_0016ed1b:
    run_test_closed_fd_events_cold_7();
LAB_0016ed20:
    run_test_closed_fd_events_cold_8();
LAB_0016ed25:
    run_test_closed_fd_events_cold_9();
LAB_0016ed2a:
    run_test_closed_fd_events_cold_10();
LAB_0016ed2f:
    run_test_closed_fd_events_cold_11();
LAB_0016ed34:
    run_test_closed_fd_events_cold_13();
LAB_0016ed39:
    run_test_closed_fd_events_cold_14();
LAB_0016ed3e:
    run_test_closed_fd_events_cold_15();
  }
  run_test_closed_fd_events_cold_16();
LAB_0016ed48:
  run_test_closed_fd_events_cold_12();
  uv_read_stop();
  on_read((uv_stream_t *)puVar4,(ssize_t)nread,buf);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(spawn_auto_unref) {
  init_process_options("spawn_helper1", NULL);
  ASSERT(0 == uv_spawn(uv_default_loop(), &process, &options));
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT(0 == uv_is_closing((uv_handle_t*) &process));
  uv_close((uv_handle_t*) &process, NULL);
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT(1 == uv_is_closing((uv_handle_t*) &process));
  MAKE_VALGRIND_HAPPY();
  return 0;
}